

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Print.cpp
# Opt level: O2

void wasm::PrintExpressionContents::handleResumeTable<wasm::Resume>(ostream *o,Resume *curr)

{
  Name *pNVar1;
  uint uVar2;
  ulong index;
  string_view str;
  
  for (uVar2 = 0; index = (ulong)uVar2,
      index < (curr->handlerTags).super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>.
              usedElements; uVar2 = uVar2 + 1) {
    std::operator<<(o," (");
    str._M_str = "on ";
    str._M_len = 3;
    printMedium(o,str);
    pNVar1 = ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>::operator[]
                       (&(curr->handlerTags).
                         super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>,index);
    Name::print(pNVar1,o);
    std::operator<<(o,' ');
    pNVar1 = ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>::operator[]
                       (&(curr->handlerBlocks).
                         super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>,index);
    if ((pNVar1->super_IString).str._M_str == (char *)0x0) {
      std::operator<<(o,"switch");
    }
    else {
      pNVar1 = ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>::operator[]
                         (&(curr->handlerBlocks).
                           super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>,index);
      Name::print(pNVar1,o);
    }
    std::operator<<(o,')');
  }
  return;
}

Assistant:

static void handleResumeTable(std::ostream& o, ResumeType* curr) {
    static_assert(std::is_base_of<ResumeType, Resume>::value ||
                  std::is_base_of<ResumeType, ResumeThrow>::value);
    for (Index i = 0; i < curr->handlerTags.size(); i++) {
      o << " (";
      printMedium(o, "on ");
      curr->handlerTags[i].print(o);
      o << ' ';
      if (curr->handlerBlocks[i].isNull()) {
        o << "switch";
      } else {
        curr->handlerBlocks[i].print(o);
      }
      o << ')';
    }
  }